

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operator.cpp
# Opt level: O2

UnaryOperator slang::ast::OpInfo::getUnary(SyntaxKind kind)

{
  __index_type _Var1;
  real_t rVar2;
  bool bVar3;
  logic_t lVar4;
  logic_t lVar5;
  UnaryOperator UVar6;
  size_t sVar7;
  size_t sVar8;
  TRef cvl;
  TRef cvr;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar9;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *rhs;
  uint *__v;
  variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  *in_RDX;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 *this;
  BinaryOperator in_ESI;
  undefined4 in_register_0000003c;
  variant<std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
  *this_00;
  SVInt *in_R8;
  _anonymous_namespace_ *this_01;
  bool bVar10;
  shortreal_t sVar11;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  double in_XMM1_Qa;
  logic_t lStack_d9;
  undefined1 auStack_d8 [16];
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aaStack_c0 [5];
  variant<std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
  *pvStack_98;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aaStack_90 [4];
  char cStack_70;
  _Variadic_union<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>
  _Stack_68;
  SVInt SStack_40;
  
  this_00 = (variant<std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
             *)CONCAT44(in_register_0000003c,kind);
  switch(kind) {
  case UnaryBitwiseAndExpression:
    return BitwiseAnd;
  case UnaryBitwiseNandExpression:
    return BitwiseNand;
  case UnaryBitwiseNorExpression:
    return BitwiseNor;
  case UnaryBitwiseNotExpression:
    return BitwiseNot;
  case UnaryBitwiseOrExpression:
    return BitwiseOr;
  case UnaryBitwiseXnorExpression:
    return BitwiseXnor;
  case UnaryBitwiseXorExpression:
    return BitwiseXor;
  case UnaryConditionalDirectiveExpression:
    break;
  case UnaryLogicalNotExpression:
    return LogicalNot;
  case UnaryMinusExpression:
    return Minus;
  case UnaryPlusExpression:
    return Plus;
  case UnaryPredecrementExpression:
    return Predecrement;
  case UnaryPreincrementExpression:
    return Preincrement;
  default:
    if (kind == PostdecrementExpression) {
      UVar6 = Postdecrement;
    }
    else {
      UVar6 = Postincrement;
    }
    return UVar6;
  }
  __v = &switchD_003d4596::switchdataD_004564d0;
  switch(kind) {
  case LessThanEqualExpression:
    return Postincrement|BitwiseAnd;
  case LessThanExpression:
    return 0x10;
  case LetDeclaration:
  case LibraryDeclaration:
  case LibraryIncDirClause:
  case LibraryIncludeStatement:
  case LibraryMap:
  case LineDirective:
  case LocalScope:
  case LocalVariableDeclaration:
  case LogicType:
    goto code_r0x003d4626;
  case LogicalAndExpression:
    return 0x13;
  case LogicalEquivalenceExpression:
    return 0x16;
  case LogicalImplicationExpression:
    return 0x15;
  case LogicalLeftShiftAssignmentExpression:
  case LogicalShiftLeftExpression:
    return 0x17;
  case LogicalOrExpression:
    return 0x14;
  case LogicalRightShiftAssignmentExpression:
  case LogicalShiftRightExpression:
    return 0x18;
  }
  __v = &switchD_003d45ad::switchdataD_0045646c;
  switch(kind) {
  case AddAssignmentExpression:
  case AddExpression:
    return Plus;
  case AlwaysBlock:
  case AlwaysCombBlock:
  case AlwaysFFBlock:
  case AlwaysLatchBlock:
  case AndPropertyExpr:
  case AndSequenceExpr:
  case AnonymousProgram:
  case AnsiPortList:
  case AnsiUdpPortList:
  case ArgumentList:
    goto code_r0x003d4626;
  case AndAssignmentExpression:
switchD_003d45c0_caseD_29:
    UVar6 = BitwiseXor;
    break;
  case ArithmeticLeftShiftAssignmentExpression:
  case ArithmeticShiftLeftExpression:
    UVar6 = 0x19;
    break;
  case ArithmeticRightShiftAssignmentExpression:
  case ArithmeticShiftRightExpression:
    UVar6 = 0x1a;
    break;
  default:
    __v = &switchD_003d45c0::switchdataD_004564b0;
    switch(kind) {
    case BinaryAndExpression:
      goto switchD_003d45c0_caseD_29;
    case BinaryBinsSelectExpr:
    case BinaryBlockEventExpression:
    case BinaryConditionalDirectiveExpression:
    case BinaryEventExpression:
      goto code_r0x003d4626;
    case BinaryOrExpression:
      return BitwiseNand;
    case BinaryXnorExpression:
      return BitwiseXnor;
    case BinaryXorExpression:
      return BitwiseNor;
    default:
      if (kind == CaseEqualityExpression) {
        return Predecrement;
      }
      if (kind == CaseInequalityExpression) {
        return Postincrement;
      }
      if ((kind == DivideAssignmentExpression) || (kind == DivideExpression)) {
        return BitwiseAnd;
      }
      if (kind == EqualityExpression) {
        return LogicalNot;
      }
      if (kind == GreaterThanEqualExpression) {
        return Postdecrement;
      }
      if (kind == GreaterThanExpression) {
        return Postincrement|BitwiseNot;
      }
      if (kind == InequalityExpression) {
        return Preincrement;
      }
      if ((kind == ModAssignmentExpression) || (kind == ModExpression)) {
        return BitwiseOr;
      }
      if ((kind != MultiplyAssignmentExpression) && (kind != MultiplyExpression)) {
        if (kind == OrAssignmentExpression) {
          return BitwiseNand;
        }
        if (kind == PowerExpression) {
          return 0x1b;
        }
        if (kind != SubtractAssignmentExpression) {
          if (kind == XorAssignmentExpression) {
            return BitwiseNor;
          }
          if (kind == WildcardEqualityExpression) {
            return 0x11;
          }
          if (kind == WildcardInequalityExpression) {
            return 0x12;
          }
        }
        return Minus;
      }
      return BitwiseNot;
    }
  }
  return UVar6;
code_r0x003d4626:
  _Var1 = (in_RDX->
          super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ).
          super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          .
          super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          .
          super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          .
          super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          .
          super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ._M_index;
  if ((_Var1 == '\0') ||
     ((((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
         *)__v)->
      super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ).
      super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ._M_index == '\0')) {
    this_00[0x20] =
         (variant<std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
          )0x0;
    goto switchD_003d48c9_default;
  }
  this_01 = (_anonymous_namespace_ *)(ulong)in_ESI;
  switch(_Var1) {
  case '\x01':
    pvVar9 = std::
             get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                       (in_RDX);
    _Var1 = (((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               *)__v)->
            super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ).
            super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ._M_index;
    if (_Var1 == '\x03') {
      sVar11 = ConstantValue::shortReal((ConstantValue *)__v);
      bVar3 = NAN(sVar11.v);
      bVar10 = sVar11.v == 0.0;
LAB_003d4aab:
      aaStack_c0[0]._0_1_ = !bVar10 | bVar3;
      (anonymous_namespace)::evalLogicalOp<slang::SVInt,bool>
                ((ConstantValue *)this_00,this_01,(BinaryOperator)pvVar9,(SVInt *)aaStack_c0,
                 (bool *)in_R8);
      goto switchD_003d48c9_default;
    }
    if (_Var1 == '\x02') {
      rVar2 = ConstantValue::real((ConstantValue *)__v);
      bVar3 = NAN(rVar2.v);
      bVar10 = rVar2.v == 0.0;
      goto LAB_003d4aab;
    }
    if (_Var1 != '\x01') goto switchD_003d48c9_default;
    break;
  case '\x02':
    rVar2 = ConstantValue::real((ConstantValue *)in_RDX);
    _Var1 = (((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               *)__v)->
            super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ).
            super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ._M_index;
    if (_Var1 == '\x01') {
      bVar3 = NAN(rVar2.v);
      bVar10 = rVar2.v == 0.0;
LAB_003d4ad2:
      aaStack_c0[0]._0_1_ = !bVar10 | bVar3;
      pvVar9 = std::
               get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                         ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           *)__v);
      (anonymous_namespace)::evalLogicalOp<bool,slang::SVInt>
                ((ConstantValue *)this_00,this_01,(BinaryOperator)aaStack_c0,(bool *)pvVar9,in_R8);
      goto switchD_003d48c9_default;
    }
    if (_Var1 != '\x03') {
      if (_Var1 == '\x02') {
        auStack_d8._8_4_ = extraout_XMM0_Dc_00;
        auStack_d8._0_8_ = rVar2.v;
        auStack_d8._12_4_ = extraout_XMM0_Dd_00;
        rVar2 = ConstantValue::real((ConstantValue *)__v);
        UVar6 = (*(code *)(&DAT_004565dc + *(int *)(&DAT_004565dc + (long)this_01 * 4)))
                          (SUB84(rVar2.v,0),rVar2.v);
        return UVar6;
      }
      goto switchD_003d48c9_default;
    }
    aaStack_c0[0]._0_1_ = rVar2.v != 0.0;
    sVar11 = ConstantValue::shortReal((ConstantValue *)__v);
    bVar3 = NAN(sVar11.v);
    bVar10 = sVar11.v == 0.0;
    goto LAB_003d4a36;
  case '\x03':
    auStack_d8._0_4_ = ConstantValue::shortReal((ConstantValue *)in_RDX);
    _Var1 = (((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               *)__v)->
            super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ).
            super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ._M_index;
    if (_Var1 == '\x01') {
      bVar3 = NAN((float)auStack_d8._0_4_);
      bVar10 = (float)auStack_d8._0_4_ == 0.0;
      goto LAB_003d4ad2;
    }
    if (_Var1 != '\x02') {
      if (_Var1 == '\x03') {
        auStack_d8._4_4_ = extraout_XMM0_Db;
        auStack_d8._8_4_ = extraout_XMM0_Dc;
        auStack_d8._12_4_ = extraout_XMM0_Dd;
        sVar11 = ConstantValue::shortReal((ConstantValue *)__v);
        UVar6 = (*(code *)(&DAT_0045656c + *(int *)(&DAT_0045656c + (long)this_01 * 4)))
                          (sVar11.v,sVar11.v);
        return UVar6;
      }
      goto switchD_003d48c9_default;
    }
    aaStack_c0[0]._0_1_ = (float)auStack_d8._0_4_ != 0.0;
    rVar2 = ConstantValue::real((ConstantValue *)__v);
    bVar3 = NAN(rVar2.v);
    bVar10 = rVar2.v == 0.0;
LAB_003d4a36:
    _Stack_68._0_1_ = !bVar10 || bVar3;
    (anonymous_namespace)::evalLogicalOp<bool,bool>
              ((ConstantValue *)this_00,this_01,(BinaryOperator)aaStack_c0,(bool *)&_Stack_68,
               (bool *)in_R8);
    goto switchD_003d48c9_default;
  case '\x04':
    UVar6 = (*(code *)(&DAT_0045653c + *(int *)(&DAT_0045653c + (ulong)(in_ESI - Equality) * 4)))();
    return UVar6;
  case '\x05':
  case '\a':
  case '\b':
    sVar7 = ConstantValue::size((ConstantValue *)in_RDX);
    sVar8 = ConstantValue::size((ConstantValue *)__v);
    if (sVar7 == sVar8) {
      begin<const_slang::ConstantValue,_true>
                ((CVIterator<true> *)aaStack_c0,(ConstantValue *)in_RDX);
      begin<const_slang::ConstantValue,_true>
                ((CVIterator<true> *)&_Stack_68._M_first,(ConstantValue *)__v);
      auStack_d8._0_8_ = in_RDX;
      pvStack_98 = this_00;
      while( true ) {
        this_00 = pvStack_98;
        end<const_slang::ConstantValue,_true>
                  ((CVIterator<true> *)aaStack_90,(ConstantValue *)in_RDX);
        bVar3 = std::operator==((variant<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>
                                 *)aaStack_c0,
                                (variant<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>
                                 *)aaStack_90);
        if (bVar3) break;
        cvl = CVIterator<true>::dereference((CVIterator<true> *)aaStack_c0);
        cvr = CVIterator<true>::dereference((CVIterator<true> *)&_Stack_68._M_first);
        eval((ConstantValue *)aaStack_90,in_ESI,cvl,cvr);
        if (cStack_70 == '\0') {
          this_00[0x20] =
               (variant<std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                )0x0;
LAB_003d49bb:
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               *)aaStack_90);
          goto switchD_003d48c9_default;
        }
        pvVar9 = std::
                 get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                           ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)aaStack_90);
        lVar4 = SVInt::reductionOr(pvVar9);
        lStack_d9 = lVar4;
        lVar5 = logic_t::operator!(&lStack_d9);
        if (((lVar4.value == 0x80) || (lVar4.value == '@')) ||
           ((lVar5.value != '\0' && ((lVar5.value != 0x80 && (lVar5.value != '@')))))) {
          SVInt::SVInt(&SStack_40,lStack_d9);
          this_00 = pvStack_98;
          std::
          variant<std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
          ::variant<slang::SVInt,void,void,slang::SVInt,void>(pvStack_98,&SStack_40);
          SVInt::~SVInt(&SStack_40);
          goto LAB_003d49bb;
        }
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)aaStack_90);
        iterator_facade<slang::CVIterator<true>,_false>::operator++<slang::CVIterator<true>_>
                  ((self_type *)aaStack_90,
                   (iterator_facade<slang::CVIterator<true>,_false> *)aaStack_c0,0);
        iterator_facade<slang::CVIterator<true>,_false>::operator++<slang::CVIterator<true>_>
                  ((self_type *)aaStack_90,
                   (iterator_facade<slang::CVIterator<true>,_false> *)&_Stack_68._M_first,0);
        in_RDX = (variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                  *)auStack_d8._0_8_;
      }
      this = aaStack_90;
      bVar3 = true;
    }
    else {
      this = aaStack_c0;
      bVar3 = false;
    }
    SVInt::SVInt<bool>((SVInt *)this,bVar3);
    goto LAB_003d4a75;
  case '\x06':
    std::
    get<6ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
              (in_RDX);
    std::
    get<6ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
              ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                *)__v);
    UVar6 = (*(code *)(&DAT_0045654c + *(int *)(&DAT_0045654c + (ulong)(in_ESI - Equality) * 4)))();
    return UVar6;
  default:
    UVar6 = (*(code *)(&DAT_004566bc + *(int *)(&DAT_004566bc + (ulong)(in_ESI - Equality) * 4)))();
    return UVar6;
  }
  rhs = std::
        get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                  ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                    *)__v);
  switch(this_01) {
  case (_anonymous_namespace_ *)0x0:
    this = aaStack_c0;
    SVInt::operator+((SVInt *)this,pvVar9);
    goto LAB_003d4a75;
  case (_anonymous_namespace_ *)0x1:
    this = aaStack_c0;
    SVInt::operator-((SVInt *)this,pvVar9);
    goto LAB_003d4a75;
  case (_anonymous_namespace_ *)0x2:
    this = aaStack_c0;
    SVInt::operator*((SVInt *)this,pvVar9);
    goto LAB_003d4a75;
  case (_anonymous_namespace_ *)0x3:
    this = aaStack_c0;
    SVInt::operator/((SVInt *)this,pvVar9);
    goto LAB_003d4a75;
  case (_anonymous_namespace_ *)0x4:
    this = aaStack_c0;
    SVInt::operator%((SVInt *)this,pvVar9);
    goto LAB_003d4a75;
  case (_anonymous_namespace_ *)0x5:
    this = aaStack_c0;
    SVInt::operator&((SVInt *)this,pvVar9);
    goto LAB_003d4a75;
  case (_anonymous_namespace_ *)0x6:
    this = aaStack_c0;
    SVInt::operator|((SVInt *)this,pvVar9);
    goto LAB_003d4a75;
  case (_anonymous_namespace_ *)0x7:
    this = aaStack_c0;
    SVInt::operator^((SVInt *)this,pvVar9);
    goto LAB_003d4a75;
  case (_anonymous_namespace_ *)0x8:
    this = aaStack_c0;
    SVInt::xnor((SVInt *)this,pvVar9);
    goto LAB_003d4a75;
  case (_anonymous_namespace_ *)0x9:
    lVar4 = SVInt::operator==(pvVar9,rhs);
    break;
  case (_anonymous_namespace_ *)0xa:
    lVar4 = SVInt::operator!=(pvVar9,rhs);
    break;
  case (_anonymous_namespace_ *)0xb:
    lVar4.value = exactlyEqual(pvVar9,rhs);
    break;
  case (_anonymous_namespace_ *)0xc:
    bVar3 = exactlyEqual(pvVar9,rhs);
    lVar4.value = !bVar3;
    break;
  case (_anonymous_namespace_ *)0xd:
    lVar4 = SVInt::operator>=(pvVar9,rhs);
    break;
  case (_anonymous_namespace_ *)0xe:
    lVar4 = SVInt::operator>(pvVar9,rhs);
    break;
  case (_anonymous_namespace_ *)0xf:
    lVar4 = SVInt::operator<=(pvVar9,rhs);
    break;
  case (_anonymous_namespace_ *)0x10:
    lVar4 = SVInt::operator<(pvVar9,rhs);
    break;
  case (_anonymous_namespace_ *)0x11:
    lVar4 = condWildcardEqual(pvVar9,rhs);
    break;
  case (_anonymous_namespace_ *)0x12:
    _Stack_68._0_1_ = condWildcardEqual(pvVar9,rhs);
    lVar4 = logic_t::operator!((logic_t *)&_Stack_68._M_first);
    break;
  case (_anonymous_namespace_ *)0x13:
    lVar4 = SVInt::operator&&(pvVar9,rhs);
    break;
  case (_anonymous_namespace_ *)0x14:
    lVar4 = SVInt::operator||(pvVar9,rhs);
    break;
  case (_anonymous_namespace_ *)0x15:
    lVar4 = SVInt::logicalImpl(pvVar9,rhs);
    break;
  case (_anonymous_namespace_ *)0x16:
    lVar4 = SVInt::logicalEquiv(pvVar9,rhs);
    break;
  case (_anonymous_namespace_ *)0x17:
  case (_anonymous_namespace_ *)0x19:
    this = aaStack_c0;
    SVInt::shl((SVInt *)this,pvVar9);
    goto LAB_003d4a75;
  case (_anonymous_namespace_ *)0x18:
    this = aaStack_c0;
    SVInt::lshr((SVInt *)this,pvVar9);
    goto LAB_003d4a75;
  case (_anonymous_namespace_ *)0x1a:
    this = aaStack_c0;
    SVInt::ashr((SVInt *)this,pvVar9);
    goto LAB_003d4a75;
  case (_anonymous_namespace_ *)0x1b:
    this = aaStack_c0;
    SVInt::pow((SVInt *)this,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da),in_XMM1_Qa);
    goto LAB_003d4a75;
  default:
    goto switchD_003d48c9_default;
  }
  this = aaStack_c0;
  SVInt::SVInt((SVInt *)this,lVar4);
LAB_003d4a75:
  std::
  variant<std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
  ::variant<slang::SVInt,void,void,slang::SVInt,void>(this_00,(SVInt *)this);
  SVInt::~SVInt((SVInt *)this);
switchD_003d48c9_default:
  return (UnaryOperator)this_00;
}

Assistant:

UnaryOperator OpInfo::getUnary(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::UnaryPlusExpression:
            return UnaryOperator::Plus;
        case SyntaxKind::UnaryMinusExpression:
            return UnaryOperator::Minus;
        case SyntaxKind::UnaryBitwiseNotExpression:
            return UnaryOperator::BitwiseNot;
        case SyntaxKind::UnaryBitwiseAndExpression:
            return UnaryOperator::BitwiseAnd;
        case SyntaxKind::UnaryBitwiseOrExpression:
            return UnaryOperator::BitwiseOr;
        case SyntaxKind::UnaryBitwiseXorExpression:
            return UnaryOperator::BitwiseXor;
        case SyntaxKind::UnaryBitwiseNandExpression:
            return UnaryOperator::BitwiseNand;
        case SyntaxKind::UnaryBitwiseNorExpression:
            return UnaryOperator::BitwiseNor;
        case SyntaxKind::UnaryBitwiseXnorExpression:
            return UnaryOperator::BitwiseXnor;
        case SyntaxKind::UnaryLogicalNotExpression:
            return UnaryOperator::LogicalNot;
        case SyntaxKind::UnaryPreincrementExpression:
            return UnaryOperator::Preincrement;
        case SyntaxKind::UnaryPredecrementExpression:
            return UnaryOperator::Predecrement;
        case SyntaxKind::PostincrementExpression:
            return UnaryOperator::Postincrement;
        case SyntaxKind::PostdecrementExpression:
            return UnaryOperator::Postdecrement;
        default:
            SLANG_UNREACHABLE;
    }
}